

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliCopyLZ77Store(ZopfliLZ77Store *source,ZopfliLZ77Store *dest)

{
  uchar *puVar1;
  size_t sVar2;
  ulong uVar3;
  size_t __size;
  ulong uVar4;
  unsigned_short *puVar5;
  unsigned_short *puVar6;
  size_t *psVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  size_t *psVar10;
  size_t *psVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar4 = (source->size + 0x11f) / 0x120;
  uVar13 = source->size + 0x1f & 0xffffffffffffffe0;
  ZopfliCleanLZ77Store(dest);
  puVar1 = source->data;
  dest->litlens = (unsigned_short *)0x0;
  dest->dists = (unsigned_short *)0x0;
  dest->size = 0;
  dest->data = puVar1;
  dest->ll_symbol = (unsigned_short *)0x0;
  dest->d_symbol = (unsigned_short *)0x0;
  dest->ll_counts = (size_t *)0x0;
  dest->d_counts = (size_t *)0x0;
  sVar2 = source->size;
  __size = sVar2 * 2;
  puVar5 = (unsigned_short *)malloc(__size);
  dest->litlens = puVar5;
  puVar6 = (unsigned_short *)malloc(__size);
  dest->dists = puVar6;
  psVar7 = (size_t *)malloc(sVar2 * 8);
  dest->pos = psVar7;
  puVar8 = (unsigned_short *)malloc(__size);
  dest->ll_symbol = puVar8;
  puVar9 = (unsigned_short *)malloc(__size);
  dest->d_symbol = puVar9;
  psVar10 = (size_t *)malloc(uVar4 * 0x900);
  dest->ll_counts = psVar10;
  psVar11 = (size_t *)malloc(uVar13 * 8);
  dest->d_counts = psVar11;
  if ((((puVar5 != (unsigned_short *)0x0) && (puVar6 != (unsigned_short *)0x0)) &&
      (psVar7 != (size_t *)0x0)) &&
     (((puVar8 != (unsigned_short *)0x0 && (puVar9 != (unsigned_short *)0x0)) &&
      ((psVar10 != (size_t *)0x0 && (psVar11 != (size_t *)0x0)))))) {
    dest->size = sVar2;
    uVar3 = source->size;
    for (uVar14 = 0; uVar14 < uVar3; uVar14 = uVar14 + 1) {
      puVar5[uVar14] = source->litlens[uVar14];
      puVar6[uVar14] = source->dists[uVar14];
      psVar7[uVar14] = source->pos[uVar14];
      puVar8[uVar14] = source->ll_symbol[uVar14];
      puVar9[uVar14] = source->d_symbol[uVar14];
    }
    for (lVar12 = 0; uVar4 * 0x120 - lVar12 != 0; lVar12 = lVar12 + 1) {
      psVar10[lVar12] = source->ll_counts[lVar12];
    }
    for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
      psVar11[uVar4] = source->d_counts[uVar4];
    }
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliCopyLZ77Store(
    const ZopfliLZ77Store* source, ZopfliLZ77Store* dest) {
  size_t i;
  size_t llsize = ZOPFLI_NUM_LL * CeilDiv(source->size, ZOPFLI_NUM_LL);
  size_t dsize = ZOPFLI_NUM_D * CeilDiv(source->size, ZOPFLI_NUM_D);
  ZopfliCleanLZ77Store(dest);
  ZopfliInitLZ77Store(source->data, dest);
  dest->litlens =
      (unsigned short*)malloc(sizeof(*dest->litlens) * source->size);
  dest->dists = (unsigned short*)malloc(sizeof(*dest->dists) * source->size);
  dest->pos = (size_t*)malloc(sizeof(*dest->pos) * source->size);
  dest->ll_symbol =
      (unsigned short*)malloc(sizeof(*dest->ll_symbol) * source->size);
  dest->d_symbol =
      (unsigned short*)malloc(sizeof(*dest->d_symbol) * source->size);
  dest->ll_counts = (size_t*)malloc(sizeof(*dest->ll_counts) * llsize);
  dest->d_counts = (size_t*)malloc(sizeof(*dest->d_counts) * dsize);

  /* Allocation failed. */
  if (!dest->litlens || !dest->dists) exit(-1);
  if (!dest->pos) exit(-1);
  if (!dest->ll_symbol || !dest->d_symbol) exit(-1);
  if (!dest->ll_counts || !dest->d_counts) exit(-1);

  dest->size = source->size;
  for (i = 0; i < source->size; i++) {
    dest->litlens[i] = source->litlens[i];
    dest->dists[i] = source->dists[i];
    dest->pos[i] = source->pos[i];
    dest->ll_symbol[i] = source->ll_symbol[i];
    dest->d_symbol[i] = source->d_symbol[i];
  }
  for (i = 0; i < llsize; i++) {
    dest->ll_counts[i] = source->ll_counts[i];
  }
  for (i = 0; i < dsize; i++) {
    dest->d_counts[i] = source->d_counts[i];
  }
}